

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O1

bool __thiscall
cmParseJacocoCoverage::XMLParser::PackagePathFound(XMLParser *this,string *fileName,string *baseDir)

{
  ulong __n1;
  cmCTest *this_00;
  int iVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ostream *poVar3;
  pointer fileOrDir;
  bool bVar4;
  bool bVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string dir;
  string packageGlob;
  Glob gl;
  ostringstream cmCTestLog_msg;
  string local_278;
  string *local_258;
  string *local_250;
  pointer local_248;
  long *local_240;
  long local_230 [2];
  string local_220;
  Glob local_200;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_1a8;
  undefined8 local_190;
  size_type *local_188;
  undefined8 local_180;
  size_type local_178;
  pointer local_170;
  undefined8 local_168;
  ios_base local_138 [264];
  
  local_1a8.first._M_str = (baseDir->_M_dataplus)._M_p;
  local_1a8.first._M_len = baseDir->_M_string_length;
  local_1a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_200.Relative._M_dataplus._M_p = (pointer)&local_200.Relative._M_string_length;
  local_200.Internals = (GlobInternals *)0x0;
  local_200.Recurse = true;
  local_200._9_7_ = 0;
  local_200.Relative._M_string_length._0_1_ = 0x2f;
  local_190 = 1;
  local_180 = 0;
  local_170 = (fileName->_M_dataplus)._M_p;
  local_178 = fileName->_M_string_length;
  local_168 = 0;
  views._M_len = 3;
  views._M_array = &local_1a8;
  local_250 = fileName;
  local_188 = (size_type *)local_200.Relative._M_dataplus._M_p;
  cmCatViews(&local_220,views);
  cmsys::Glob::Glob(&local_200);
  local_200.Recurse = true;
  local_200.RecurseThroughSymlinks = true;
  cmsys::Glob::FindFiles(&local_200,&local_220,(GlobMessages *)0x0);
  pvVar2 = cmsys::Glob::GetFiles_abi_cxx11_(&local_200);
  fileOrDir = (pvVar2->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_248 = (pvVar2->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (fileOrDir == local_248) {
    bVar5 = false;
  }
  else {
    local_258 = (string *)&this->PackagePath;
    bVar5 = true;
    do {
      cmsys::SystemTools::GetParentDirectory(&local_278,fileOrDir);
      __n1 = (this->PackageName)._M_string_length;
      local_1a8.first._M_len = local_278._M_string_length;
      local_1a8.first._M_str = local_278._M_dataplus._M_p;
      if (local_278._M_string_length < __n1) {
        bVar4 = false;
      }
      else {
        __str._M_str = (this->PackageName)._M_dataplus._M_p;
        __str._M_len = __n1;
        iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (&local_1a8.first,local_278._M_string_length - __n1,__n1,__str);
        bVar4 = iVar1 == 0;
      }
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Found package directory for ",0x1c);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(local_250->_M_dataplus)._M_p,
                            local_250->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_278._M_dataplus._M_p,local_278._M_string_length);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        this_00 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                     ,0x7d,(char *)local_240,this->Coverage->Quiet);
        if (local_240 != local_230) {
          operator_delete(local_240,local_230[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::string::_M_assign(local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) break;
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      fileOrDir = fileOrDir + 1;
      bVar5 = fileOrDir != local_248;
    } while (bVar5);
  }
  cmsys::Glob::~Glob(&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

virtual bool PackagePathFound(std::string const& fileName,
                                std::string const& baseDir)
  {
    // Search for the file in the baseDir and its subdirectories.
    std::string packageGlob = cmStrCat(baseDir, '/', fileName);
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOn();
    gl.FindFiles(packageGlob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      return false;
    }

    // Check if any of the locations found match our package.
    for (std::string const& f : files) {
      std::string dir = cmsys::SystemTools::GetParentDirectory(f);
      if (cmHasSuffix(dir, this->PackageName)) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Found package directory for " << fileName << ": "
                                                          << dir << std::endl,
                           this->Coverage.Quiet);
        this->PackagePath = dir;
        return true;
      }
    }
    return false;
  }